

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

void __thiscall serialization::xml_iarchive::load_sequence_item_end(xml_iarchive *this)

{
  reference ppxVar1;
  xml_node<char> *pxVar2;
  serialization_trace local_11;
  xml_iarchive *pxStack_10;
  serialization_trace trace;
  xml_iarchive *this_local;
  
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[23],char_const(&)[5]>
            (&local_11,(char (*) [23])"load_sequence_item_end",(char (*) [5])"json");
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  pxVar2 = rapidxml::xml_node<char>::next_sibling(*ppxVar1,"item",0,true);
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  *ppxVar1 = pxVar2;
  return;
}

Assistant:

void load_sequence_item_end() const
    {
        serialization_trace trace(__func__, "json");
        stack_.top() = stack_.top()->next_sibling("item");
    }